

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1716::run(TestCase1716 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  MessageSize MVar2;
  uint64_t local_238;
  uint local_230;
  int local_228;
  bool local_221;
  uint64_t uStack_220;
  bool _kj_shouldLog_5;
  uint local_218;
  bool local_20a;
  bool local_209;
  undefined1 local_208 [6];
  bool _kj_shouldLog_4;
  bool _kj_shouldLog_3;
  BuilderFor<capnproto_test::capnp::test::TestEmptyStruct> local_1d8;
  Builder local_1b0;
  bool local_192;
  bool local_191;
  undefined1 local_190 [6];
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  uint64_t local_160;
  uint local_158;
  int local_150;
  bool local_149;
  uint64_t uStack_148;
  bool _kj_shouldLog;
  uint local_140;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder message;
  TestCase1716 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize((Builder *)local_128);
  uStack_148 = MVar2.wordCount;
  local_140 = MVar2.capCount;
  if (uStack_148 != 1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      local_150 = 1;
      MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize((Builder *)local_128);
      local_160 = MVar2.wordCount;
      local_158 = MVar2.capCount;
      kj::_::Debug::log<char_const(&)[53],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x6b8,ERROR,
                 "\"failed: expected \" \"(1) == (root.totalSize().wordCount)\", 1, root.totalSize().wordCount"
                 ,(char (*) [53])"failed: expected (1) == (root.totalSize().wordCount)",&local_150,
                 &local_160);
      local_149 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_190,(Builder *)local_128);
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Reader::hasAnyPointerField
                    ((Reader *)local_190);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_191 = kj::_::Debug::shouldLog(ERROR);
    while (local_191 != false) {
      kj::_::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x6ba,ERROR,"\"failed: expected \" \"!(root.asReader().hasAnyPointerField())\"",
                 (char (*) [57])"failed: expected !(root.asReader().hasAnyPointerField())");
      local_191 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Builder::hasAnyPointerField
                    ((Builder *)local_128);
  if (bVar1) {
    local_192 = kj::_::Debug::shouldLog(ERROR);
    while (local_192 != false) {
      kj::_::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x6bb,ERROR,"\"failed: expected \" \"!(root.hasAnyPointerField())\"",
                 (char (*) [46])"failed: expected !(root.hasAnyPointerField())");
      local_192 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1b0,(Builder *)local_128);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestEmptyStruct>(&local_1d8,&local_1b0);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_208,(Builder *)local_128);
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Reader::hasAnyPointerField
                    ((Reader *)local_208);
  if (!bVar1) {
    local_209 = kj::_::Debug::shouldLog(ERROR);
    while (local_209 != false) {
      kj::_::Debug::log<char_const(&)[54]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x6bd,ERROR,"\"failed: expected \" \"root.asReader().hasAnyPointerField()\"",
                 (char (*) [54])"failed: expected root.asReader().hasAnyPointerField()");
      local_209 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAnyPointer::Builder::hasAnyPointerField
                    ((Builder *)local_128);
  if (!bVar1) {
    local_20a = kj::_::Debug::shouldLog(ERROR);
    while (local_20a != false) {
      kj::_::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x6be,ERROR,"\"failed: expected \" \"root.hasAnyPointerField()\"",
                 (char (*) [43])"failed: expected root.hasAnyPointerField()");
      local_20a = false;
    }
  }
  MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize((Builder *)local_128);
  uStack_220 = MVar2.wordCount;
  local_218 = MVar2.capCount;
  if (uStack_220 != 1) {
    local_221 = kj::_::Debug::shouldLog(ERROR);
    while (local_221 != false) {
      local_228 = 1;
      MVar2 = capnproto_test::capnp::test::TestAnyPointer::Builder::totalSize((Builder *)local_128);
      local_238 = MVar2.wordCount;
      local_230 = MVar2.capCount;
      kj::_::Debug::log<char_const(&)[53],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x6c0,ERROR,
                 "\"failed: expected \" \"(1) == (root.totalSize().wordCount)\", 1, root.totalSize().wordCount"
                 ,(char (*) [53])"failed: expected (1) == (root.totalSize().wordCount)",&local_228,
                 &local_238);
      local_221 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, HasEmptyStruct) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestAnyPointer>();

  EXPECT_EQ(1, root.totalSize().wordCount);

  EXPECT_FALSE(root.asReader().hasAnyPointerField());
  EXPECT_FALSE(root.hasAnyPointerField());
  root.getAnyPointerField().initAs<test::TestEmptyStruct>();
  EXPECT_TRUE(root.asReader().hasAnyPointerField());
  EXPECT_TRUE(root.hasAnyPointerField());

  EXPECT_EQ(1, root.totalSize().wordCount);
}